

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

ENetPeer *
enet_host_connect(ENetHost *host,ENetAddress *address,size_t channelCount,enet_uint32 data)

{
  enet_uint32 eVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  ENetPeer *pEVar7;
  ENetChannel *pEVar8;
  uint32_t in_ECX;
  enet_uint32 eVar9;
  ulong in_RDX;
  ENetAddress *in_RSI;
  _ENetHost *in_RDI;
  int i;
  ENetProtocol command;
  ENetChannel *channel;
  ENetPeer *currentPeer;
  enet_uint16 length;
  undefined2 in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 uVar10;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 uVar11;
  undefined2 in_stack_ffffffffffffff98;
  enet_uint8 eVar12;
  enet_uint8 eVar13;
  ENetChannel *local_38;
  ENetPeer *local_30;
  size_t local_20;
  ENetPeer *local_8;
  
  if (in_RDX == 0) {
    local_20 = 1;
  }
  else {
    local_20 = in_RDX;
    if (0xff < in_RDX) {
      local_20 = 0xff;
    }
  }
  eVar1 = 0;
  while (((ulong)(long)(int)eVar1 < in_RDI->peerCount &&
         (local_30 = in_RDI->peer_list[(int)eVar1], local_30->state != ENET_PEER_STATE_DISCONNECTED)
         )) {
    eVar1 = eVar1 + 1;
  }
  if (in_RDI->peerCount <= (ulong)(long)(int)eVar1) {
    if (0xfffffe < (int)eVar1) {
      return (ENetPeer *)0x0;
    }
    in_RDI->peerCount = in_RDI->peerCount + 1;
    pEVar7 = (ENetPeer *)
             enet_malloc(CONCAT17(in_stack_ffffffffffffff97,
                                  CONCAT16(in_stack_ffffffffffffff96,
                                           CONCAT24(in_stack_ffffffffffffff94,eVar1))));
    in_RDI->peer_list[(int)eVar1] = pEVar7;
    memset(in_RDI->peer_list[(int)eVar1],0,0x1d8);
    local_30 = in_RDI->peer_list[(int)eVar1];
    local_30->host = in_RDI;
    local_30->incomingPeerID = eVar1;
    local_30->incomingSessionID = 0xff;
    local_30->outgoingSessionID = 0xff;
    local_30->data = (void *)0x0;
    enet_list_clear(&local_30->acknowledgements);
    enet_list_clear(&local_30->sentReliableCommands);
    enet_list_clear(&local_30->sentUnreliableCommands);
    enet_list_clear(&local_30->outgoingReliableCommands);
    enet_list_clear(&local_30->outgoingUnreliableCommands);
    enet_list_clear(&local_30->dispatchedCommands);
    enet_peer_reset((ENetPeer *)0x105605);
  }
  pEVar8 = (ENetChannel *)
           enet_malloc(CONCAT17(in_stack_ffffffffffffff97,
                                CONCAT16(in_stack_ffffffffffffff96,
                                         CONCAT24(in_stack_ffffffffffffff94,eVar1))));
  local_30->channels = pEVar8;
  if (local_30->channels == (ENetChannel *)0x0) {
    local_8 = (ENetPeer *)0x0;
  }
  else {
    local_30->channelCount = local_20;
    local_30->state = ENET_PEER_STATE_CONNECTING;
    local_30->address = *in_RSI;
    eVar9 = in_RDI->randomSeed + 1;
    in_RDI->randomSeed = eVar9;
    local_30->connectID = eVar9;
    if (in_RDI->outgoingBandwidth == 0) {
      local_30->windowSize = 0x10000;
    }
    else {
      local_30->windowSize = (in_RDI->outgoingBandwidth >> 0x10) << 0xc;
    }
    if (local_30->windowSize < 0x1000) {
      local_30->windowSize = 0x1000;
    }
    else if (0x10000 < local_30->windowSize) {
      local_30->windowSize = 0x10000;
    }
    for (local_38 = local_30->channels; local_38 < local_30->channels + local_20;
        local_38 = local_38 + 1) {
      local_38->outgoingReliableSequenceNumber = 0;
      local_38->outgoingUnreliableSequenceNumber = 0;
      local_38->incomingReliableSequenceNumber = 0;
      local_38->incomingUnreliableSequenceNumber = 0;
      enet_list_clear(&local_38->incomingReliableCommands);
      enet_list_clear(&local_38->incomingUnreliableCommands);
      local_38->usedReliableWindows = 0;
      memset(local_38->reliableWindows,0,0x20);
    }
    uVar10 = 0x82;
    uVar11 = 0xff;
    uVar2 = htonl(local_30->incomingPeerID);
    eVar12 = local_30->incomingSessionID;
    eVar13 = local_30->outgoingSessionID;
    uVar3 = htonl(local_30->mtu);
    uVar4 = htonl(local_30->windowSize);
    uVar5 = htonl((uint32_t)local_20);
    uVar6 = htonl(in_RDI->incomingBandwidth);
    htonl(in_RDI->outgoingBandwidth);
    htonl(local_30->packetThrottleInterval);
    htonl(local_30->packetThrottleAcceleration);
    htonl(local_30->packetThrottleDeceleration);
    length = (enet_uint16)(eVar1 >> 0x10);
    htonl(in_ECX);
    enet_peer_queue_outgoing_command
              ((ENetPeer *)CONCAT44(uVar6,uVar5),(ENetProtocol *)CONCAT44(uVar4,uVar3),
               (ENetPacket *)
               CONCAT17(eVar13,CONCAT16(eVar12,CONCAT42(uVar2,in_stack_ffffffffffffff98))),
               CONCAT13(uVar11,CONCAT12(uVar10,in_stack_ffffffffffffff94)),length);
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

ENetPeer *
enet_host_connect (ENetHost * host, const ENetAddress * address, size_t channelCount, enet_uint32 data)
{
    ENetPeer * currentPeer;
    ENetChannel * channel;
    ENetProtocol command;
    int i;

    if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
      channelCount = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;
    else
    if (channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
      channelCount = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;

    for (i = 0; i < host -> peerCount; i++ )
    {
       currentPeer = host -> peer_list[i];

       if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED)
         break;
    }

    if (i >= host -> peerCount)
    {
	if (i >= ENET_PROTOCOL_MAXIMUM_PEER_ID) 
	    return NULL;
	host -> peerCount++;
	host -> peer_list[i] = enet_malloc (sizeof (ENetPeer));
	memset (host -> peer_list[i], 0, sizeof (ENetPeer));
	currentPeer = host->peer_list[i];
	currentPeer -> host = host;
	currentPeer -> incomingPeerID = i;
	currentPeer -> outgoingSessionID = currentPeer -> incomingSessionID = 0xFF;
	currentPeer -> data = NULL;

	enet_list_clear (& currentPeer -> acknowledgements);
	enet_list_clear (& currentPeer -> sentReliableCommands);
	enet_list_clear (& currentPeer -> sentUnreliableCommands);
	enet_list_clear (& currentPeer -> outgoingReliableCommands);
	enet_list_clear (& currentPeer -> outgoingUnreliableCommands);
	enet_list_clear (& currentPeer -> dispatchedCommands);

	enet_peer_reset (currentPeer);
    }

    currentPeer -> channels = (ENetChannel *) enet_malloc (channelCount * sizeof (ENetChannel));
    if (currentPeer -> channels == NULL)
      return NULL;
    currentPeer -> channelCount = channelCount;
    currentPeer -> state = ENET_PEER_STATE_CONNECTING;
    currentPeer -> address = * address;
    currentPeer -> connectID = ++ host -> randomSeed;

    if (host -> outgoingBandwidth == 0)
      currentPeer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
    else
      currentPeer -> windowSize = (host -> outgoingBandwidth /
                                    ENET_PEER_WINDOW_SIZE_SCALE) * 
                                      ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

    if (currentPeer -> windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
      currentPeer -> windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
    if (currentPeer -> windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
      currentPeer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
         
    for (channel = currentPeer -> channels;
         channel < & currentPeer -> channels [channelCount];
         ++ channel)
    {
        channel -> outgoingReliableSequenceNumber = 0;
        channel -> outgoingUnreliableSequenceNumber = 0;
        channel -> incomingReliableSequenceNumber = 0;
        channel -> incomingUnreliableSequenceNumber = 0;

        enet_list_clear (& channel -> incomingReliableCommands);
        enet_list_clear (& channel -> incomingUnreliableCommands);

        channel -> usedReliableWindows = 0;
        memset (channel -> reliableWindows, 0, sizeof (channel -> reliableWindows));
    }
        
    command.header.command = ENET_PROTOCOL_COMMAND_CONNECT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
    command.header.channelID = 0xFF;
    command.connect.outgoingPeerID = ENET_HOST_TO_NET_32 (currentPeer -> incomingPeerID);
    command.connect.incomingSessionID = currentPeer -> incomingSessionID;
    command.connect.outgoingSessionID = currentPeer -> outgoingSessionID;
    command.connect.mtu = ENET_HOST_TO_NET_32 (currentPeer -> mtu);
    command.connect.windowSize = ENET_HOST_TO_NET_32 (currentPeer -> windowSize);
    command.connect.channelCount = ENET_HOST_TO_NET_32 (channelCount);
    command.connect.incomingBandwidth = ENET_HOST_TO_NET_32 (host -> incomingBandwidth);
    command.connect.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);
    command.connect.packetThrottleInterval = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleInterval);
    command.connect.packetThrottleAcceleration = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleAcceleration);
    command.connect.packetThrottleDeceleration = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleDeceleration);
    command.connect.connectID = currentPeer -> connectID;
    command.connect.data = ENET_HOST_TO_NET_32 (data);
 
    enet_peer_queue_outgoing_command (currentPeer, & command, NULL, 0, 0);

    return currentPeer;
}